

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void step_cb(Fl_Value_Input *i,void *v)

{
  double s;
  Fl_Type *pFVar1;
  bool bVar2;
  int iVar3;
  Fl_Widget_Type *q;
  Fl_Type **ppFVar4;
  Fl_Image *v_00;
  
  if ((char *)v == "LOAD") {
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1c])();
    if (iVar3 == 0) {
      iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1d])();
      if (iVar3 == 0) {
        Fl_Widget::deactivate((Fl_Widget *)i);
        return;
      }
      Fl_Widget::activate((Fl_Widget *)i);
      v_00 = current_widget->o[1].label_.deimage;
    }
    else {
      Fl_Widget::activate((Fl_Widget *)i);
      v_00 = (Fl_Image *)(*(double *)&current_widget->o[1].x_ / (double)current_widget->o[1].w_);
    }
    Fl_Valuator::value(&i->super_Fl_Valuator,(double)v_00);
    return;
  }
  s = (i->super_Fl_Valuator).value_;
  bVar2 = false;
  ppFVar4 = &Fl_Type::first;
  do {
    pFVar1 = *ppFVar4;
    if (pFVar1 == (Fl_Type *)0x0) {
      if (bVar2) {
        set_modflag(1);
        return;
      }
      return;
    }
    if (pFVar1->selected != '\0') {
      iVar3 = (*pFVar1->_vptr_Fl_Type[0x17])(pFVar1);
      if (iVar3 != 0) {
        iVar3 = (*pFVar1->_vptr_Fl_Type[0x1c])(pFVar1);
        if (iVar3 == 0) {
          iVar3 = (*pFVar1->_vptr_Fl_Type[0x1d])(pFVar1);
          if (iVar3 == 0) goto LAB_001876d3;
          Fl_Spinner::step((Fl_Spinner *)pFVar1[1].prev,s);
        }
        else {
          Fl_Valuator::step((Fl_Valuator *)pFVar1[1].prev,s);
        }
        Fl_Widget::redraw((Fl_Widget *)pFVar1[1].prev);
        bVar2 = true;
      }
    }
LAB_001876d3:
    ppFVar4 = &pFVar1->next;
  } while( true );
}

Assistant:

void step_cb(Fl_Value_Input* i, void* v) {
  if (v == LOAD) {
    if (current_widget->is_valuator()) {
      i->activate();
      i->value(((Fl_Valuator*)(current_widget->o))->step());
    } else if (current_widget->is_spinner()) {
      i->activate();
      i->value(((Fl_Spinner*)(current_widget->o))->step());
    } else {
      i->deactivate();
      return;
    }
  } else {
    int mod = 0;
    double n = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        Fl_Widget_Type* q = (Fl_Widget_Type*)o;
        if (q->is_valuator()) {
          ((Fl_Valuator*)(q->o))->step(n);
          q->o->redraw();
          mod = 1;
        } else if (q->is_spinner()) {
          ((Fl_Spinner*)(q->o))->step(n);
          q->o->redraw();
          mod = 1;
        }
      }
    }
    if (mod) set_modflag(1);
  }
}